

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

void Abc_NodeStrash_rec(Abc_Aig_t *pMan,Hop_Obj_t *pObj)

{
  ulong *puVar1;
  Abc_Obj_t *p1;
  Abc_Obj_t *pAVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1bf,"void Abc_NodeStrash_rec(Abc_Aig_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Abc_NodeStrash_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_NodeStrash_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    puVar1 = (ulong *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      pAVar2 = (Abc_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Abc_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *puVar1);
    }
    puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      p1 = (Abc_Obj_t *)0x0;
    }
    else {
      p1 = (Abc_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
    }
    pAVar2 = Abc_AigAnd(pMan,pAVar2,p1);
    (pObj->field_0).pData = pAVar2;
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                    ,0x1c5,"void Abc_NodeStrash_rec(Abc_Aig_t *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

void Abc_NodeStrash_rec( Abc_Aig_t * pMan, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_NodeStrash_rec( pMan, Hop_ObjFanin0(pObj) ); 
    Abc_NodeStrash_rec( pMan, Hop_ObjFanin1(pObj) );
    pObj->pData = Abc_AigAnd( pMan, (Abc_Obj_t *)Hop_ObjChild0Copy(pObj), (Abc_Obj_t *)Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}